

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

bool __thiscall
icu_63::number::LocalizedNumberFormatter::computeCompiled
          (LocalizedNumberFormatter *this,UErrorCode *status)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  NumberFormatterImpl *this_00;
  
  iVar4 = *(int *)this->fUnsafeCallCount;
  if ((-1 < iVar4) &&
     (iVar2 = (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.threshold, 0 < iVar2 && iVar4 <= iVar2)) {
    LOCK();
    pcVar1 = this->fUnsafeCallCount;
    iVar4 = *(int *)pcVar1;
    *(int *)pcVar1 = *(int *)pcVar1 + 1;
    UNLOCK();
    iVar4 = iVar4 + 1;
  }
  iVar2 = (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
          threshold;
  if (iVar2 < 1 || iVar4 != iVar2) {
    bVar3 = SUB41((uint)iVar4 >> 0x1f,0);
  }
  else {
    this_00 = (NumberFormatterImpl *)UMemory::operator_new((UMemory *)0x218,(size_t)status);
    if (this_00 == (NumberFormatterImpl *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      bVar3 = false;
    }
    else {
      impl::NumberFormatterImpl::NumberFormatterImpl(this_00,(MacroProps *)this,status);
      this->fCompiled = this_00;
      this->fUnsafeCallCount[0] = '\0';
      this->fUnsafeCallCount[1] = '\0';
      this->fUnsafeCallCount[2] = '\0';
      this->fUnsafeCallCount[3] = -0x80;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool LocalizedNumberFormatter::computeCompiled(UErrorCode& status) const {
    // fUnsafeCallCount contains memory to be interpreted as an atomic int, most commonly
    // std::atomic<int32_t>.  Since the type of atomic int is platform-dependent, we cast the
    // bytes in fUnsafeCallCount to u_atomic_int32_t, a typedef for the platform-dependent
    // atomic int type defined in umutex.h.
    static_assert(
            sizeof(u_atomic_int32_t) <= sizeof(fUnsafeCallCount),
            "Atomic integer size on this platform exceeds the size allocated by fUnsafeCallCount");
    auto* callCount = reinterpret_cast<u_atomic_int32_t*>(
            const_cast<LocalizedNumberFormatter*>(this)->fUnsafeCallCount);

    // A positive value in the atomic int indicates that the data structure is not yet ready;
    // a negative value indicates that it is ready. If, after the increment, the atomic int
    // is exactly threshold, then it is the current thread's job to build the data structure.
    // Note: We set the callCount to INT32_MIN so that if another thread proceeds to increment
    // the atomic int, the value remains below zero.
    int32_t currentCount = umtx_loadAcquire(*callCount);
    if (0 <= currentCount && currentCount <= fMacros.threshold && fMacros.threshold > 0) {
        currentCount = umtx_atomic_inc(callCount);
    }

    if (currentCount == fMacros.threshold && fMacros.threshold > 0) {
        // Build the data structure and then use it (slow to fast path).
        const NumberFormatterImpl* compiled = new NumberFormatterImpl(fMacros, status);
        if (compiled == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return false;
        }
        U_ASSERT(fCompiled == nullptr);
        const_cast<LocalizedNumberFormatter*>(this)->fCompiled = compiled;
        umtx_storeRelease(*callCount, INT32_MIN);
        return true;
    } else if (currentCount < 0) {
        // The data structure is already built; use it (fast path).
        U_ASSERT(fCompiled != nullptr);
        return true;
    } else {
        // Format the number without building the data structure (slow path).
        return false;
    }
}